

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::TextFormatDecodeData::Data_abi_cxx11_
          (string *__return_storage_ptr__,TextFormatDecodeData *this)

{
  bool bVar1;
  size_t sVar2;
  pointer ppVar3;
  __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_248;
  __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_240;
  const_iterator i;
  CodedOutputStream output_stream;
  OstreamOutputStream data_outputstream;
  ostringstream local_190 [8];
  ostringstream data_stringstream;
  TextFormatDecodeData *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  sVar2 = num_entries(this);
  if (sVar2 != 0) {
    io::OstreamOutputStream::OstreamOutputStream
              ((OstreamOutputStream *)&output_stream.start_count_,(ostream *)local_190,-1);
    io::CodedOutputStream::CodedOutputStream
              ((CodedOutputStream *)&i,(ZeroCopyOutputStream *)&output_stream.start_count_);
    sVar2 = num_entries(this);
    io::CodedOutputStream::WriteVarint32((CodedOutputStream *)&i,(uint32_t)sVar2);
    local_240._M_current =
         (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin(&this->entries_);
    while( true ) {
      local_248._M_current =
           (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->entries_);
      bVar1 = __gnu_cxx::operator!=(&local_240,&local_248);
      if (!bVar1) break;
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_240);
      io::CodedOutputStream::WriteVarint32((CodedOutputStream *)&i,ppVar3->first);
      ppVar3 = __gnu_cxx::
               __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator->(&local_240);
      io::CodedOutputStream::WriteString((CodedOutputStream *)&i,&ppVar3->second);
      __gnu_cxx::
      __normal_iterator<const_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_240);
    }
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&i);
    io::OstreamOutputStream::~OstreamOutputStream
              ((OstreamOutputStream *)&output_stream.start_count_);
  }
  std::ostream::flush();
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string TextFormatDecodeData::Data() const {
  std::ostringstream data_stringstream;

  if (num_entries() > 0) {
    io::OstreamOutputStream data_outputstream(&data_stringstream);
    io::CodedOutputStream output_stream(&data_outputstream);

    output_stream.WriteVarint32(num_entries());
    for (std::vector<DataEntry>::const_iterator i = entries_.begin();
         i != entries_.end(); ++i) {
      output_stream.WriteVarint32(i->first);
      output_stream.WriteString(i->second);
    }
  }

  data_stringstream.flush();
  return data_stringstream.str();
}